

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockAnalyzerSettings.cpp
# Opt level: O0

void __thiscall
SimpleParallelAnalyzerSettings::~SimpleParallelAnalyzerSettings
          (SimpleParallelAnalyzerSettings *this)

{
  SimpleParallelAnalyzerSettings *this_local;
  
  ~SimpleParallelAnalyzerSettings(this);
  operator_delete(this);
  return;
}

Assistant:

SimpleParallelAnalyzerSettings::~SimpleParallelAnalyzerSettings()
{
	U32 count = (U32)mDataChannelsInterface.size();
	for( U32 i=0; i<count; i++ )
		delete mDataChannelsInterface[i];
}